

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ArgMinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_argmin(NeuralNetworkLayer *this)

{
  bool bVar1;
  ArgMinLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_argmin(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_argmin(this);
    this_00 = (ArgMinLayerParams *)operator_new(0x20);
    ArgMinLayerParams::ArgMinLayerParams(this_00);
    (this->layer_).argmin_ = this_00;
  }
  return (ArgMinLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgMinLayerParams* NeuralNetworkLayer::mutable_argmin() {
  if (!has_argmin()) {
    clear_layer();
    set_has_argmin();
    layer_.argmin_ = new ::CoreML::Specification::ArgMinLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.argMin)
  return layer_.argmin_;
}